

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O1

bool __thiscall ON_PointCloud::Transform(ON_PointCloud *this,ON_Xform *xform)

{
  bool bVar1;
  
  ON_Object::TransformUserData((ON_Object *)this,xform);
  bVar1 = ON_3dPointArray::Transform(&this->m_P,xform);
  if ((bVar1) && ((this->m_flags & 2) != 0)) {
    bVar1 = ON_Plane::Transform(&this->m_plane,xform);
  }
  ON_BoundingBox::Destroy(&this->m_bbox);
  return bVar1;
}

Assistant:

bool ON_PointCloud::Transform( 
       const ON_Xform& xform
       )
{
  TransformUserData(xform);
  bool rc = m_P.Transform(xform);
  if (rc && HasPlane() )
    rc = m_plane.Transform(xform);
  m_bbox.Destroy();
  return rc;
}